

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

Character * __thiscall Map::GetCharacter(Map *this,string *name)

{
  Character *pCVar1;
  int iVar2;
  _List_node_base *p_Var3;
  string local_50;
  
  util::lowercase(&local_50,name);
  std::__cxx11::string::operator=((string *)name,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  p_Var3 = (_List_node_base *)&this->characters;
  do {
    p_Var3 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var3->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)&this->characters) {
      return (Character *)0x0;
    }
    pCVar1 = (Character *)p_Var3[1]._M_next;
    (*(pCVar1->super_Command_Source)._vptr_Command_Source[2])(&local_50,pCVar1);
    iVar2 = std::__cxx11::string::compare((string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  } while (iVar2 != 0);
  return pCVar1;
}

Assistant:

Character *Map::GetCharacter(std::string name)
{
	name = util::lowercase(name);

	UTIL_FOREACH(this->characters, character)
	{
		if (character->SourceName().compare(name) == 0)
		{
			return character;
		}
	}

	return 0;
}